

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

FlagList * absl::internal::anon_unknown_1::GetFlagList(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::GetFlagList()::flag_list == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GetFlagList()::flag_list);
    if (iVar1 != 0) {
      GetFlagList::flag_list = (FlagList *)operator_new(0x18);
      (GetFlagList::flag_list->
      super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (GetFlagList::flag_list->
      super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (GetFlagList::flag_list->
      super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_guard_release(&(anonymous_namespace)::GetFlagList()::flag_list);
    }
  }
  return GetFlagList::flag_list;
}

Assistant:

FlagList *GetFlagList() {
  static auto *flag_list = new FlagList;
  return flag_list;
}